

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixFileLock(unixFile *pFile,flock *pLock)

{
  long lVar1;
  unixInodeInfo *puVar2;
  int iVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((pFile->ctrlFlags & 3) == 1) {
    puVar2 = pFile->pInode;
    iVar3 = 0;
    if (puVar2->bProcessLock == '\0') {
      iVar3 = (*aSyscall[7].pCurrent)((ulong)(uint)pFile->h,6);
      if (-1 < iVar3) {
        puVar2->bProcessLock = '\x01';
        puVar2->nLock = puVar2->nLock + 1;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return iVar3;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    iVar3 = (*aSyscall[7].pCurrent)((ulong)(uint)pFile->h,6,pLock,aSyscall[7].pCurrent);
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

static int unixFileLock(unixFile *pFile, struct flock *pLock){
  int rc;
  unixInodeInfo *pInode = pFile->pInode;
  assert( pInode!=0 );
  assert( sqlite3_mutex_held(pInode->pLockMutex) );
  if( (pFile->ctrlFlags & (UNIXFILE_EXCL|UNIXFILE_RDONLY))==UNIXFILE_EXCL ){
    if( pInode->bProcessLock==0 ){
      struct flock lock;
      /* assert( pInode->nLock==0 ); <-- Not true if unix-excl READONLY used */
      lock.l_whence = SEEK_SET;
      lock.l_start = SHARED_FIRST;
      lock.l_len = SHARED_SIZE;
      lock.l_type = F_WRLCK;
      rc = osSetPosixAdvisoryLock(pFile->h, &lock, pFile);
      if( rc<0 ) return rc;
      pInode->bProcessLock = 1;
      pInode->nLock++;
    }else{
      rc = 0;
    }
  }else{
    rc = osSetPosixAdvisoryLock(pFile->h, pLock, pFile);
  }
  return rc;
}